

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

iterator * __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
::find<unsigned_long,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
          (iterator *__return_storage_ptr__,void *this,key_arg<unsigned_long> *key,size_t hashval,
          DoNothing *mutexlock)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  iterator iVar3;
  
  uVar2 = (ulong)((((uint)(hashval >> 0x18) & 0xff ^
                   (uint)(hashval >> 8) & 0xffffff ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x30
                 );
  iVar3 = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)((long)this + uVar2),key,hashval);
  pcVar1 = (ctrl_t *)(*(long *)((long)this + uVar2) + *(long *)((long)this + uVar2 + 0x18));
  if (pcVar1 == iVar3.ctrl_) {
    (__return_storage_ptr__->it_end_).ctrl_ = (ctrl_t *)0x0;
    __return_storage_ptr__->inner_ = (Inner *)0x0;
    __return_storage_ptr__->inner_end_ = (Inner *)0x0;
    (__return_storage_ptr__->it_).ctrl_ = (ctrl_t *)0x0;
  }
  else {
    __return_storage_ptr__->inner_ = (Inner *)((long)this + uVar2);
    __return_storage_ptr__->inner_end_ = (Inner *)((long)this + 0x300);
    (__return_storage_ptr__->it_).ctrl_ = iVar3.ctrl_;
    (__return_storage_ptr__->it_).field_1 = iVar3.field_1;
    (__return_storage_ptr__->it_end_).ctrl_ = pcVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

iterator find(const key_arg<K>& key, size_t hashval, L& mutexlock) {
        Inner& inner = sets_[subidx(hashval)];
        auto& set = inner.set_;
        mutexlock = std::move(L(inner));
        return make_iterator(&inner, set.find(key, hashval));
    }